

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall
SSTable::toSSTable(SSTable *this,SkipList *memTable,string *fileName,uint64_t timeStamp)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_long n;
  uint64_t n_00;
  uint64_t n_01;
  uint64_t *puVar3;
  string *psVar4;
  runtime_error *this_00;
  void *__buf;
  uint32_t n_02;
  ConstIterator i;
  ofstream out;
  byte abStack_2a10 [480];
  BloomFilter bloomFilter;
  
  std::ofstream::ofstream(&out,(string *)memTable,_S_trunc|_S_out|_S_bin);
  if ((abStack_2a10[*(long *)(_out + -0x18)] & 5) == 0) {
    n = SkipList::getLength((SkipList *)this);
    n_00 = SkipList::getMinKey((SkipList *)this);
    n_01 = SkipList::getMaxKey((SkipList *)this);
    write64(&out,(uint64_t)fileName);
    write64(&out,n);
    write64(&out,n_00);
    write64(&out,n_01);
    BloomFilter::BloomFilter(&bloomFilter,(SkipList *)this);
    BloomFilter::write(&bloomFilter,(int)&out,__buf,timeStamp);
    i = SkipList::constBegin((SkipList *)this);
    n_02 = 0;
    while( true ) {
      bVar2 = SkipList::ConstIterator::hasNext(&i);
      if (!bVar2) break;
      SkipList::ConstIterator::next(&i);
      puVar3 = SkipList::ConstIterator::key(&i);
      write64(&out,*puVar3);
      write32(&out,n_02);
      psVar4 = SkipList::ConstIterator::value_abi_cxx11_(&i);
      n_02 = n_02 + (int)psVar4->_M_string_length;
    }
    write64(&out,0);
    write32(&out,n_02);
    i = SkipList::constBegin((SkipList *)this);
    while( true ) {
      bVar2 = SkipList::ConstIterator::hasNext(&i);
      if (!bVar2) break;
      SkipList::ConstIterator::next(&i);
      psVar4 = SkipList::ConstIterator::value_abi_cxx11_(&i);
      pcVar1 = (psVar4->_M_dataplus)._M_p;
      SkipList::ConstIterator::value_abi_cxx11_(&i);
      std::ostream::write((char *)&out,(long)pcVar1);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 "toSSTable(SkipList): open file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)memTable);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bloomFilter,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i," failed!")
  ;
  std::runtime_error::runtime_error(this_00,(string *)&bloomFilter);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::toSSTable(const SkipList &memTable, const string &fileName,
                        uint64_t timeStamp) {
  ofstream out(fileName, ios::out | ios::binary | ios::trunc);
  if (out.fail())
    throw runtime_error("toSSTable(SkipList): open file " + fileName +
                        " failed!");

  auto length = memTable.getLength();
  auto min = memTable.getMinKey();
  auto max = memTable.getMaxKey();

  // Header
  write64(out, timeStamp);
  write64(out, length);
  write64(out, min);
  write64(out, max);

  // Bloom Filter
  BloomFilter bloomFilter(memTable);
  bloomFilter.write(out);

  // Key, Offset
  auto i = memTable.constBegin();
  uint32_t offset = 0;
  while (i.hasNext()) {
    i.next();
    write64(out, i.key());
    write32(out, offset);
    offset += i.value().size();
  }
  write64(out, 0);
  write32(out, offset);

  // Value
  i = memTable.constBegin();
  while (i.hasNext()) {
    i.next();
    out.write(i.value().c_str(), i.value().size());
  }

  out.close();
}